

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O0

void glist_donewloadbangs(_glist *x)

{
  t_gobj *ptVar1;
  t_symbol *ptVar2;
  t_gotfn p_Var3;
  t_selection *local_18;
  t_selection *sel;
  _glist *x_local;
  
  if (x->gl_editor != (t_editor *)0x0) {
    for (local_18 = x->gl_editor->e_selection; local_18 != (t_selection *)0x0;
        local_18 = local_18->sel_next) {
      if (local_18->sel_what->g_pd == canvas_class) {
        canvas_loadbang((_glist *)local_18->sel_what);
      }
      else {
        ptVar1 = local_18->sel_what;
        ptVar2 = gensym("loadbang");
        p_Var3 = zgetfn(&ptVar1->g_pd,ptVar2);
        if (p_Var3 != (t_gotfn)0x0) {
          ptVar1 = local_18->sel_what;
          ptVar2 = gensym("loadbang");
          pd_vmess(&ptVar1->g_pd,ptVar2,"f",0);
        }
      }
    }
  }
  return;
}

Assistant:

static void glist_donewloadbangs(t_glist *x)
{
    if (x->gl_editor)
    {
        t_selection *sel;
        for (sel = x->gl_editor->e_selection; sel; sel = sel->sel_next)
            if (pd_class(&sel->sel_what->g_pd) == canvas_class)
                canvas_loadbang((t_canvas *)(&sel->sel_what->g_pd));
            else if (zgetfn(&sel->sel_what->g_pd, gensym("loadbang")))
                vmess(&sel->sel_what->g_pd, gensym("loadbang"), "f", LB_LOAD);
    }
}